

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::Tensor::SerializeWithCachedSizes(Tensor *this,CodedOutputStream *output)

{
  uint64 value;
  int index;
  int iVar1;
  
  if (this->rank_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(1,this->rank_,output);
  }
  iVar1 = (this->dimvalue_).current_size_;
  if (0 < iVar1) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x12);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_dimvalue_cached_byte_size_)
    ;
    iVar1 = (this->dimvalue_).current_size_;
  }
  index = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
    index = 0;
  }
  for (; iVar1 != index; index = index + 1) {
    value = dimvalue(this,index);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,value);
  }
  return;
}

Assistant:

void Tensor::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Tensor)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint32 rank = 1;
  if (this->rank() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(1, this->rank(), output);
  }

  // repeated int64 dimValue = 2;
  if (this->dimvalue_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_dimvalue_cached_byte_size_);
  }
  for (int i = 0, n = this->dimvalue_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->dimvalue(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Tensor)
}